

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

int __thiscall QDateTimeEditPrivate::closestSection(QDateTimeEditPrivate *this,int pos,bool forward)

{
  bool bVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  QString *pQVar7;
  long in_FS_OFFSET;
  bool bVar8;
  bool bVar9;
  SectionNode SVar10;
  bool local_6c;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)pos < *(long *)(*(long *)&this->field_0x428 + 0x10)) {
    iVar6 = (uint)forward * 2 + -2;
  }
  else {
    pQVar7 = &local_58;
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d._0_4_ = 0xaaaaaaaa;
    local_58.d.d._4_4_ = 0xaaaaaaaa;
    local_58.d.ptr._0_4_ = 0xaaaaaaaa;
    local_58.d.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
              (pQVar7,this);
    if (*(long *)(*(long *)&this->field_0x428 + -8 + *(long *)&this->field_0x430 * 0x18) <
        local_58.d.size - pos) {
      updateCache(this,&(this->super_QAbstractSpinBoxPrivate).value,&local_58);
      bVar8 = *(long *)&this->field_0x418 != 0;
      if (bVar8) {
        lVar4 = 8;
        uVar5 = 0;
        local_6c = !forward;
        do {
          SVar10._8_8_ = *(undefined8 *)(*(long *)&this->field_0x410 + -8 + lVar4);
          SVar10._0_8_ = &this->super_QDateTimeParser;
          iVar6 = QDateTimeParser::sectionPos(SVar10);
          iVar3 = QDateTimeParser::sectionSize((int)&this->super_QDateTimeParser);
          if (pos < iVar3 + iVar6) {
            pQVar7 = (QString *)(ulong)((int)uVar5 - (uint)(pos < iVar6 && local_6c));
            bVar1 = false;
          }
          else {
            bVar9 = uVar5 != *(long *)&this->field_0x418 - 1U;
            bVar1 = pos <= iVar6 || bVar9;
            pQVar7 = (QString *)((ulong)pQVar7 & 0xffffffff);
            if (pos > iVar6 && !bVar9) {
              pQVar7 = (QString *)(uVar5 & 0xffffffff);
            }
          }
          if (!bVar1) break;
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x10;
          bVar8 = uVar5 < *(ulong *)&this->field_0x418;
        } while (uVar5 < *(ulong *)&this->field_0x418);
      }
      iVar6 = (int)pQVar7;
      if (!bVar8) {
        closestSection();
        iVar6 = -1;
      }
    }
    else {
      iVar6 = -3;
      if (!forward) {
        iVar6 = *(int *)&this->field_0x418 + -1;
      }
    }
    piVar2 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),2,0x10)
        ;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

int QDateTimeEditPrivate::closestSection(int pos, bool forward) const
{
    Q_ASSERT(pos >= 0);
    if (pos < separators.first().size())
        return forward ? 0 : FirstSectionIndex;

    const QString text = displayText();
    if (text.size() - pos < separators.last().size() + 1)
        return forward ? LastSectionIndex : int(sectionNodes.size() - 1);

    updateCache(value, text);
    for (int i=0; i<sectionNodes.size(); ++i) {
        const int tmp = sectionPos(sectionNodes.at(i));
        if (pos < tmp + sectionSize(i)) {
            if (pos < tmp && !forward) {
                return i-1;
            }
            return i;
        } else if (i == sectionNodes.size() - 1 && pos > tmp) {
            return i;
        }
    }
    qWarning("QDateTimeEdit: Internal Error: closestSection returned NoSection");
    return NoSectionIndex;
}